

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void gegenbauer_ek_compute(int n,double alpha,double a,double b,double *x,double *w)

{
  char *pcVar1;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"GEGENBAUER_EK_COMPUTE - Fatal error!\n");
    pcVar1 = "  1 <= N is required.\n";
  }
  else {
    if (-1.0 < alpha) {
      cgqf(n,3,alpha,0.0,a,b,(int)w,x,w);
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"GEGENBAUER_EK_COMPUTE - Fatal error!\n");
    pcVar1 = "  -1.0 < ALPHA is required.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar1);
  exit(1);
}

Assistant:

void gegenbauer_ek_compute ( int n, double alpha, double a, double b,
  double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEGENBAUER_EK_COMPUTE computes a Gauss-Gegenbauer quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X^2)^ALPHA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 November 2015
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the order of the quadrature rule.
//
//    Input, double ALPHA, the exponent of (1-X^2) in the weight.  
//    -1.0 < ALPHA is required.
//
//    Input, double A, B, the left and right endpoints 
//    of the interval.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double beta;
  int kind;
  int lo;
//
//  Check N.
//
  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "GEGENBAUER_EK_COMPUTE - Fatal error!\n";
    std::cerr << "  1 <= N is required.\n";
    exit ( 1 );
  }
//
//  Check ALPHA.
//
  if ( alpha <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "GEGENBAUER_EK_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < ALPHA is required.\n";
    exit ( 1 );
  }
//
//  Call the general Gauss quadrature routine to get X and W.
//
  kind = 3;
  beta = 0.0;
  lo = 0;

  cgqf ( n, kind, alpha, beta, a, b, lo, x, w );

  return;
}